

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O0

void __thiscall
geometrycentral::NearestNeighborFinder::NearestNeighborFinder
          (NearestNeighborFinder *this,
          vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *points)

{
  pointer in_RDI;
  KNNImpl *unaff_retaddr;
  pointer this_00;
  pointer points_00;
  
  this_00 = in_RDI;
  points_00 = in_RDI;
  std::
  unique_ptr<geometrycentral::NearestNeighborFinder::KNNImpl,std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>>
  ::unique_ptr<std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>,void>
            ((unique_ptr<geometrycentral::NearestNeighborFinder::KNNImpl,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
              *)in_RDI);
  operator_new(200);
  KNNImpl::KNNImpl(unaff_retaddr,
                   (vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
                   points_00);
  std::
  unique_ptr<geometrycentral::NearestNeighborFinder::KNNImpl,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
  ::reset((unique_ptr<geometrycentral::NearestNeighborFinder::KNNImpl,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
           *)this_00,in_RDI);
  return;
}

Assistant:

NearestNeighborFinder::NearestNeighborFinder(const std::vector<Vector3>& points) { impl.reset(new KNNImpl(points)); }